

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O0

int pulse_stream_get_latency(cubeb_stream_conflict *stm,uint32_t *latency)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined4 *in_RSI;
  long in_RDI;
  int r;
  int negative;
  pa_usec_t r_usec;
  int local_24;
  pa_usec_t local_20;
  undefined4 *local_18;
  long local_10;
  int local_4;
  
  if ((in_RDI == 0) || (*(long *)(in_RDI + 0x10) == 0)) {
    local_4 = -1;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar2 = (*cubeb_pa_stream_get_latency)(*(pa_stream **)(in_RDI + 0x10),&local_20,&local_24);
    if (iVar2 == 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_20 * *(uint *)(local_10 + 0x3c);
      *local_18 = SUB164(auVar1 / ZEXT816(1000000),0);
      local_4 = 0;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int
pulse_stream_get_latency(cubeb_stream * stm, uint32_t * latency)
{
  pa_usec_t r_usec;
  int negative, r;

  if (!stm || !stm->output_stream) {
    return CUBEB_ERROR;
  }

  r = WRAP(pa_stream_get_latency)(stm->output_stream, &r_usec, &negative);
  assert(!negative);
  if (r) {
    return CUBEB_ERROR;
  }

  *latency = r_usec * stm->output_sample_spec.rate / PA_USEC_PER_SEC;
  return CUBEB_OK;
}